

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hpp
# Opt level: O2

Display * lambda::operator<<(Display *display,char value)

{
  char in_DL;
  undefined7 in_register_00000031;
  string local_30;
  
  show_abi_cxx11_(&local_30,(lambda *)CONCAT71(in_register_00000031,value),in_DL);
  std::operator<<((ostream *)&std::cout,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return display;
}

Assistant:

Display &operator<<(Display &display, const T value) {
    display << show(value);
    return display;
}